

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

UnaryConditionalDirectiveExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UnaryConditionalDirectiveExpressionSyntax,slang::parsing::Token,slang::syntax::ConditionalDirectiveExpressionSyntax&>
          (BumpAllocator *this,Token *args,ConditionalDirectiveExpressionSyntax *args_1)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  UnaryConditionalDirectiveExpressionSyntax *pUVar6;
  
  pUVar6 = (UnaryConditionalDirectiveExpressionSyntax *)allocate(this,0x30,8);
  TVar2 = args->kind;
  uVar3 = args->field_0x2;
  NVar4.raw = (args->numFlags).raw;
  uVar5 = args->rawLen;
  pIVar1 = args->info;
  (pUVar6->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.kind =
       UnaryConditionalDirectiveExpression;
  (pUVar6->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pUVar6->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.previewNode =
       (SyntaxNode *)0x0;
  (pUVar6->op).kind = TVar2;
  (pUVar6->op).field_0x2 = uVar3;
  (pUVar6->op).numFlags = (NumericTokenFlags)NVar4.raw;
  (pUVar6->op).rawLen = uVar5;
  (pUVar6->op).info = pIVar1;
  (pUVar6->operand).ptr = args_1;
  (args_1->super_SyntaxNode).parent = (SyntaxNode *)pUVar6;
  return pUVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }